

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O1

double __thiscall
HighsNodeQueue::emplaceNode
          (HighsNodeQueue *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgs,
          vector<int,_std::allocator<int>_> *branchPositions,double lower_bound,double estimate,
          HighsInt depth)

{
  long *plVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *__to;
  char *__from;
  double extraout_XMM0_Qa;
  HighsInt local_cc;
  double local_c8;
  double local_c0;
  OpenNode local_b8;
  
  plVar1 = (this->freeslots).c.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_cc = depth;
  local_c8 = estimate;
  local_c0 = lower_bound;
  if (plVar1 == (this->freeslots).c.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    __from = (char *)(((long)(this->nodes).
                             super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->nodes).
                             super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7);
    std::vector<HighsNodeQueue::OpenNode,std::allocator<HighsNodeQueue::OpenNode>>::
    emplace_back<std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>,std::vector<int,std::allocator<int>>,double&,double&,int&>
              ((vector<HighsNodeQueue::OpenNode,std::allocator<HighsNodeQueue::OpenNode>> *)
               &this->nodes,domchgs,branchPositions,&local_c0,&local_c8,&local_cc);
    __to = extraout_RDX_03;
  }
  else {
    __from = (char *)*plVar1;
    std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::pop
              (&this->freeslots);
    OpenNode::OpenNode(&local_b8,domchgs,branchPositions,local_c0,local_c8,local_cc);
    OpenNode::operator=((this->nodes).
                        super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)__from,&local_b8);
    __to = extraout_RDX;
    if (local_b8.domchglinks.
        super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.domchglinks.
                      super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      __to = extraout_RDX_00;
    }
    if (local_b8.branchings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.branchings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      __to = extraout_RDX_01;
    }
    if (local_b8.domchgstack.
        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.domchgstack.
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      __to = extraout_RDX_02;
    }
  }
  link(this,__from,__to);
  return extraout_XMM0_Qa;
}

Assistant:

double HighsNodeQueue::emplaceNode(std::vector<HighsDomainChange>&& domchgs,
                                   std::vector<HighsInt>&& branchPositions,
                                   double lower_bound, double estimate,
                                   HighsInt depth) {
  int64_t pos;

  assert(estimate != kHighsInf);

  if (freeslots.empty()) {
    pos = nodes.size();
    nodes.emplace_back(std::move(domchgs), std::move(branchPositions),
                       lower_bound, estimate, depth);
  } else {
    pos = freeslots.top();
    freeslots.pop();
    nodes[pos] = OpenNode(std::move(domchgs), std::move(branchPositions),
                          lower_bound, estimate, depth);
  }

  assert(nodes[pos].lower_bound == lower_bound);
  assert(nodes[pos].estimate == estimate);
  assert(nodes[pos].depth == depth);

  return link(pos);
}